

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnscapPlugIn.cpp
# Opt level: O2

void libithicap_getopt(int *argc,char ***argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sStack_40;
  
  iVar2 = libithicap_nb_names_in_m4;
LAB_00191bb1:
  libithicap_nb_names_in_m4 = iVar2;
  iVar1 = getopt(*argc,*argv,"o:r:a:x:n:t:u:A:E:ghefT");
  pcVar3 = _optarg;
  iVar2 = libithicap_nb_names_in_m4;
  switch(iVar1) {
  case 0x61:
    libithicap_allowed = _optarg;
    goto LAB_00191bb1;
  case 0x65:
    libithicap_compute_nx_domain_cache = 1;
    goto LAB_00191bb1;
  case 0x66:
    libithicap_enable_filtering = 1;
    goto LAB_00191bb1;
  case 0x6e:
    iVar2 = atoi(_optarg);
    if (iVar2 < 1) {
      fprintf(_stderr,"Invalid number of names: %s\n",pcVar3);
      iVar2 = libithicap_nb_names_in_m4;
    }
    goto LAB_00191bb1;
  case 0x6f:
    libithicap_out_file = _optarg;
    goto LAB_00191bb1;
  case 0x72:
    fwrite("The root addresses redefinition option is not yet implemented.\n",0x3f,1,_stderr);
    iVar2 = libithicap_nb_names_in_m4;
    goto LAB_00191bb1;
  case 0x74:
    pcVar3 = "Sorry, update list of registered TLD not implemented yet.\n";
    sStack_40 = 0x3a;
    break;
  case 0x75:
    pcVar3 = "Sorry, update list of special usage names (RFC6761) not implemented yet.\n";
    sStack_40 = 0x49;
    break;
  case 0x76:
    libithicap_version();
    goto LAB_00191cca;
  case 0x78:
    libithicap_banned = _optarg;
    goto LAB_00191bb1;
  default:
    if (iVar1 == 0x54) goto code_r0x00191be6;
    if (iVar1 == -1) {
      return;
    }
  case 0x62:
  case 99:
  case 100:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x77:
    libithicap_usage();
LAB_00191cca:
    exit(1);
  }
  fwrite(pcVar3,sStack_40,1,_stderr);
  goto LAB_00191cca;
code_r0x00191be6:
  libithicap_enable_tld_list = 1;
  goto LAB_00191bb1;
}

Assistant:

void libithicap_getopt(int* argc, char** argv[])
    {
        int opt;
        int exit_code = 0;

        while (exit_code == 0 && (opt = getopt(*argc, *argv, "o:r:a:x:n:t:u:A:E:ghefT")) != -1)
        {
            switch (opt)
            {
            case 'o':
                libithicap_out_file = optarg;
                break;
            case 'r':
                // root_address_file = optarg;
                fprintf(stderr, "The root addresses redefinition option is not yet implemented.\n");
                break;
            case 'a':
                libithicap_allowed = optarg;
                break;
            case 'x':
                libithicap_banned = optarg;
                break;
            case 'n':
            {
                int nb_names_in_m4;

                if ((nb_names_in_m4 = atoi(optarg)) <= 0)
                {
                    fprintf(stderr, "Invalid number of names: %s\n", optarg);
                }
                else
                {
                    libithicap_nb_names_in_m4 = (uint32_t)nb_names_in_m4;
                }
                break;
            }
            case 'e':
                libithicap_compute_nx_domain_cache = true;
                break;
            case 'f':
                libithicap_enable_filtering = true;
                break;

#ifdef PRIVACY_CONSCIOUS
            case 'A':
                libithicap_address_list = optarg;
                break;
            case 'E':
                libithicap_name_list = optarg;
                break;
            case 'g':
                libithicap_compress = true;
                break;
#endif
            case 'T':
                libithicap_enable_tld_list = true;
                break;
            case 't':
                fprintf(stderr, "Sorry, update list of registered TLD not implemented yet.\n");
                exit(1);
                break;
            case 'u':
                fprintf(stderr, "Sorry, update list of special usage names (RFC6761) not implemented yet.\n");
                exit(1);
                break;
            case 'v':
                libithicap_version();
                exit(1);
            case '?':
            case 'h':
            default:
                libithicap_usage();
                exit(1);
            }
        }
    }